

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

void __thiscall llvm::yaml::MappingNode::increment(MappingNode *this)

{
  size_type *psVar1;
  pointer pcVar2;
  unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *puVar3;
  char *pcVar4;
  Token *pTVar5;
  KeyValueNode *pKVar6;
  Scanner *this_00;
  Token local_120;
  Token local_e8;
  Token local_b0;
  TokenKind TStack_78;
  undefined4 uStack_74;
  Token T;
  Twine local_38;
  
  this_00 = *(Scanner **)
             &((((this->super_Node).Doc)->_M_t).
               super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
               ._M_t.
               super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
               .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->stream->scanner;
  if (this_00->Failed == true) {
LAB_00da966f:
    this->IsAtEnd = true;
    this->CurrentEntry = (KeyValueNode *)0x0;
    return;
  }
  if (this->CurrentEntry != (KeyValueNode *)0x0) {
    KeyValueNode::skip(this->CurrentEntry);
    if (this->Type == MT_Inline) goto LAB_00da966f;
    this_00 = *(Scanner **)
               &((((this->super_Node).Doc)->_M_t).
                 super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                 .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->stream->
                scanner;
  }
  pTVar5 = Scanner::peekNext(this_00);
  TStack_78 = pTVar5->Kind;
  uStack_74 = *(undefined4 *)&pTVar5->field_0x4;
  T.Kind = *(TokenKind *)&(pTVar5->Range).Data;
  T._4_4_ = *(undefined4 *)((long)&(pTVar5->Range).Data + 4);
  T.Range.Data = (char *)(pTVar5->Range).Length;
  psVar1 = &T.Value._M_string_length;
  pcVar2 = (pTVar5->Value)._M_dataplus._M_p;
  T.Range.Length = (size_t)psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&T.Range.Length,pcVar2,pcVar2 + (pTVar5->Value)._M_string_length);
  if ((TStack_78 & ~TK_StreamEnd) == TK_Key) {
    pKVar6 = (KeyValueNode *)
             Node::operator_new(0x58,&((((this->super_Node).Doc)->_M_t).
                                       super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                       .super__Head_base<0UL,_llvm::yaml::Document_*,_false>.
                                      _M_head_impl)->NodeAllocator,0x10);
    if (pKVar6 != (KeyValueNode *)0x0) {
      puVar3 = (this->super_Node).Doc;
      (pKVar6->super_Node)._vptr_Node = (_func_int **)&PTR_anchor_01079770;
      (pKVar6->super_Node).Doc = puVar3;
      (pKVar6->super_Node).SourceRange.Start.Ptr = (char *)0x0;
      (pKVar6->super_Node).SourceRange.End.Ptr = (char *)0x0;
      (pKVar6->super_Node).TypeID = 3;
      (pKVar6->super_Node).Anchor.Data = (char *)0x0;
      (pKVar6->super_Node).Anchor.Length = 0;
      (pKVar6->super_Node).Tag.Data = (char *)0x0;
      (pKVar6->super_Node).Tag.Length = 0;
      pTVar5 = Scanner::peekNext(*(Scanner **)
                                  &((puVar3->_M_t).
                                    super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                    .super__Head_base<0UL,_llvm::yaml::Document_*,_false>.
                                   _M_head_impl)->stream->scanner);
      pcVar4 = (pTVar5->Range).Data;
      (pKVar6->super_Node).SourceRange.Start.Ptr = pcVar4;
      (pKVar6->super_Node).SourceRange.End.Ptr = pcVar4;
      (pKVar6->super_Node)._vptr_Node = (_func_int **)&PTR_anchor_010797f0;
      pKVar6->Key = (Node *)0x0;
      pKVar6->Value = (Node *)0x0;
    }
  }
  else {
    if (this->Type == MT_Block) {
      if (TStack_78 != TK_Error) {
        if (TStack_78 == TK_BlockEnd) {
          Scanner::getNext(&local_120,
                           *(Scanner **)
                            &((((this->super_Node).Doc)->_M_t).
                              super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                              .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                             stream->scanner);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120.Value._M_dataplus._M_p != &local_120.Value.field_2) goto LAB_00da9830;
        }
        else {
          Twine::Twine(&local_38,"Unexpected token. Expected Key or Block End");
          Scanner::setError(*(Scanner **)
                             &((((this->super_Node).Doc)->_M_t).
                               super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                               .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                              stream->scanner,&local_38,(iterator)CONCAT44(T._4_4_,T.Kind));
        }
      }
    }
    else if (TStack_78 != TK_Error) {
      if (TStack_78 == TK_FlowMappingEnd) {
        Scanner::getNext(&local_b0,
                         *(Scanner **)
                          &((((this->super_Node).Doc)->_M_t).
                            super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                            .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                           stream->scanner);
        local_120.Value.field_2._M_allocated_capacity = local_b0.Value.field_2._M_allocated_capacity
        ;
        local_120.Value._M_dataplus._M_p = local_b0.Value._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0.Value._M_dataplus._M_p != &local_b0.Value.field_2) {
LAB_00da9830:
          operator_delete(local_120.Value._M_dataplus._M_p,
                          local_120.Value.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        if (TStack_78 == TK_FlowEntry) {
          Scanner::getNext(&local_e8,
                           *(Scanner **)
                            &((((this->super_Node).Doc)->_M_t).
                              super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                              .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                             stream->scanner);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8.Value._M_dataplus._M_p != &local_e8.Value.field_2) {
            operator_delete(local_e8.Value._M_dataplus._M_p,
                            local_e8.Value.field_2._M_allocated_capacity + 1);
          }
          increment(this);
          goto LAB_00da989b;
        }
        Twine::Twine(&local_38,"Unexpected token. Expected Key, Flow Entry, or Flow Mapping End.");
        Scanner::setError(*(Scanner **)
                           &((((this->super_Node).Doc)->_M_t).
                             super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                             .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                            stream->scanner,&local_38,(iterator)CONCAT44(T._4_4_,T.Kind));
      }
    }
    this->IsAtEnd = true;
    pKVar6 = (KeyValueNode *)0x0;
  }
  this->CurrentEntry = pKVar6;
LAB_00da989b:
  if ((size_type *)T.Range.Length != psVar1) {
    operator_delete((void *)T.Range.Length,T.Value._M_string_length + 1);
  }
  return;
}

Assistant:

void MappingNode::increment() {
  if (failed()) {
    IsAtEnd = true;
    CurrentEntry = nullptr;
    return;
  }
  if (CurrentEntry) {
    CurrentEntry->skip();
    if (Type == MT_Inline) {
      IsAtEnd = true;
      CurrentEntry = nullptr;
      return;
    }
  }
  Token T = peekNext();
  if (T.Kind == Token::TK_Key || T.Kind == Token::TK_Scalar) {
    // KeyValueNode eats the TK_Key. That way it can detect null keys.
    CurrentEntry = new (getAllocator()) KeyValueNode(Doc);
  } else if (Type == MT_Block) {
    switch (T.Kind) {
    case Token::TK_BlockEnd:
      getNext();
      IsAtEnd = true;
      CurrentEntry = nullptr;
      break;
    default:
      setError("Unexpected token. Expected Key or Block End", T);
      LLVM_FALLTHROUGH;
    case Token::TK_Error:
      IsAtEnd = true;
      CurrentEntry = nullptr;
    }
  } else {
    switch (T.Kind) {
    case Token::TK_FlowEntry:
      // Eat the flow entry and recurse.
      getNext();
      return increment();
    case Token::TK_FlowMappingEnd:
      getNext();
      LLVM_FALLTHROUGH;
    case Token::TK_Error:
      // Set this to end iterator.
      IsAtEnd = true;
      CurrentEntry = nullptr;
      break;
    default:
      setError( "Unexpected token. Expected Key, Flow Entry, or Flow "
                "Mapping End."
              , T);
      IsAtEnd = true;
      CurrentEntry = nullptr;
    }
  }
}